

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress1X_DCtx_wksp
                 (HUF_DTable *dctx,void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,
                 void *workSpace,size_t wkspSize,int flags)

{
  U32 UVar1;
  HUF_DTable *in_RCX;
  void *in_RDX;
  void *in_RSI;
  size_t in_RDI;
  void *in_R8;
  size_t in_R9;
  undefined4 in_stack_00000010;
  U32 algoNb;
  undefined4 in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_fffffffffffffff8;
  
  if (in_RDX == (void *)0x0) {
    in_RDX = (void *)0xffffffffffffffba;
  }
  else if (in_RDX < in_R8) {
    in_RDX = (void *)0xffffffffffffffec;
  }
  else if (in_R8 == in_RDX) {
    memcpy(in_RSI,in_RCX,(size_t)in_RDX);
  }
  else if (in_R8 == (void *)0x1) {
    memset(in_RSI,(uint)(byte)*in_RCX,(size_t)in_RDX);
  }
  else {
    UVar1 = HUF_selectDecoder(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
    if (UVar1 == 0) {
      in_RDX = (void *)HUF_decompress1X1_DCtx_wksp
                                 (in_RCX,in_R8,in_R9,(void *)(ulong)in_stack_ffffffffffffffc0,
                                  in_stack_ffffffffffffffb8,
                                  (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_00000010),
                                  in_RDI,in_stack_fffffffffffffff8);
    }
    else {
      in_RDX = (void *)HUF_decompress1X2_DCtx_wksp
                                 (in_RCX,in_R8,in_R9,
                                  (void *)CONCAT44(UVar1,in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8,
                                  (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_00000010),
                                  in_RDI,in_stack_fffffffffffffff8);
    }
  }
  return (size_t)in_RDX;
}

Assistant:

size_t HUF_decompress1X_DCtx_wksp(HUF_DTable* dctx, void* dst, size_t dstSize,
                                  const void* cSrc, size_t cSrcSize,
                                  void* workSpace, size_t wkspSize, int flags)
{
    /* validation checks */
    if (dstSize == 0) return ERROR(dstSize_tooSmall);
    if (cSrcSize > dstSize) return ERROR(corruption_detected);   /* invalid */
    if (cSrcSize == dstSize) { ZSTD_memcpy(dst, cSrc, dstSize); return dstSize; }   /* not compressed */
    if (cSrcSize == 1) { ZSTD_memset(dst, *(const BYTE*)cSrc, dstSize); return dstSize; }   /* RLE */

    {   U32 const algoNb = HUF_selectDecoder(dstSize, cSrcSize);
#if defined(HUF_FORCE_DECOMPRESS_X1)
        (void)algoNb;
        assert(algoNb == 0);
        return HUF_decompress1X1_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
        (void)algoNb;
        assert(algoNb == 1);
        return HUF_decompress1X2_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize, flags);
#else
        return algoNb ? HUF_decompress1X2_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize, flags):
                        HUF_decompress1X1_DCtx_wksp(dctx, dst, dstSize, cSrc,
                                cSrcSize, workSpace, wkspSize, flags);
#endif
    }
}